

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O2

Type __thiscall QtPromise::resolve<QFuture<void>>(QtPromise *this,QFuture<void> *value)

{
  QSharedData *pQVar1;
  PromiseData<void> *this_00;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> extraout_RDX;
  Type TVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_60;
  PromiseResolver<void> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_50;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_48;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_40;
  QPromiseBase<void> local_38;
  
  *(undefined ***)this = &PTR__QPromiseBase_00118908;
  this_00 = (PromiseData<void> *)operator_new(0x58);
  (this_00->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (this_00->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (this_00->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (this_00->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(this_00);
  *(PromiseData<void> **)(this + 8) = this_00;
  LOCK();
  pQVar1 = &(this_00->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_38.m_d.d = *(PromiseData<void> **)(this + 8);
  if (local_38.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_38.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00118a20;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_38);
  QPromiseBase<void>::~QPromiseBase(&local_38);
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_48.d = (Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_40.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_40 = resolver.m_d.d;
  }
  local_50.d = (Data *)0x0;
  local_60 = resolver.m_d.d;
  QtPromisePrivate::PromiseFulfill<QFuture<void>_>::call
            (value,(QPromiseResolve<void> *)&local_60,(QPromiseReject<void> *)&local_40);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_40);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_50);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_60);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_48);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  *(undefined ***)this = &PTR__QPromiseBase_00118a20;
  TVar2.super_QPromiseBase<void>.m_d.d = extraout_RDX.d;
  TVar2.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)this;
  return (Type)TVar2.super_QPromiseBase<void>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseDeduce<T>::Type resolve(T&& value)
{
    using namespace QtPromisePrivate;
    using PromiseType = typename PromiseDeduce<T>::Type;
    using ValueType = typename PromiseType::Type;
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseFulfill<Unqualified<T>>::call(std::forward<T>(value),
                                             std::forward<ResolveType>(resolve),
                                             std::forward<RejectType>(reject));
    }};
}